

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O1

void __thiscall amrex::EBCellFlagFab::EBCellFlagFab(EBCellFlagFab *this,Box *b,int n,Arena *ar)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  (this->super_BaseFab<amrex::EBCellFlag>).super_DataAllocator.m_arena = ar;
  (this->super_BaseFab<amrex::EBCellFlag>)._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074f108;
  (this->super_BaseFab<amrex::EBCellFlag>).dptr = (EBCellFlag *)0x0;
  uVar2 = *(undefined8 *)((b->smallend).vect + 2);
  uVar3 = *(undefined8 *)(b->bigend).vect;
  uVar4 = *(undefined8 *)((b->bigend).vect + 2);
  *(undefined8 *)(this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect =
       *(undefined8 *)(b->smallend).vect;
  *(undefined8 *)((this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect + 2) = uVar2;
  *(undefined8 *)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect = uVar3;
  *(undefined8 *)((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect + 2) = uVar4;
  (this->super_BaseFab<amrex::EBCellFlag>).nvar = n;
  (this->super_BaseFab<amrex::EBCellFlag>).truesize = 0;
  (this->super_BaseFab<amrex::EBCellFlag>).ptr_owner = false;
  (this->super_BaseFab<amrex::EBCellFlag>).shared_memory = false;
  BaseFab<amrex::EBCellFlag>::define(&this->super_BaseFab<amrex::EBCellFlag>);
  (this->super_BaseFab<amrex::EBCellFlag>)._vptr_BaseFab =
       (_func_int **)&PTR__EBCellFlagFab_0074f0a8;
  *(undefined4 *)&(this->super_BaseFab<amrex::EBCellFlag>).field_0x44 = 100;
  p_Var1 = &(this->m_typemap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_typemap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

EBCellFlagFab::EBCellFlagFab (const Box& b, int n, Arena* ar)
    : BaseFab<EBCellFlag>(b,n,ar)
{}